

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float32 float32_mul_tricore(float32 a,float32 b,float_status *s)

{
  _Bool _Var1;
  float32 fVar2;
  float fVar3;
  union_float32 ub;
  union_float32 ua;
  union_float32 local_28;
  union_float32 local_24;
  
  local_28.s = b;
  local_24.s = a;
  if (((s->float_exception_flags & 0x20) != 0) && (s->float_rounding_mode == '\0')) {
    float32_input_flush2(&local_24.s,&local_28.s,s);
    a = local_24.s;
    b = local_28.s;
    _Var1 = f32_is_zon2(local_24,local_28);
    if (_Var1) {
      if ((b & 0x7fffffff) == 0 || (a & 0x7fffffff) == 0) {
        fVar3 = (float)((b ^ a) & 0x80000000);
      }
      else {
        fVar3 = (float)b * (float)a;
        if (ABS(fVar3) == INFINITY) {
          s->float_exception_flags = s->float_exception_flags | 8;
        }
        else if (ABS(fVar3) <= 1.1754944e-38) goto LAB_00b146da;
      }
      return (float32)fVar3;
    }
  }
LAB_00b146da:
  fVar2 = soft_f32_mul(a,b,s);
  return fVar2;
}

Assistant:

float32 QEMU_FLATTEN
float32_mul(float32 a, float32 b, float_status *s)
{
    return float32_gen2(a, b, s, hard_f32_mul, soft_f32_mul,
                        f32_is_zon2, NULL, f32_mul_fast_test, f32_mul_fast_op);
}